

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

char * Acb_RemapOneFunction(char *pStr,Vec_Int_t *vSupp,Vec_Int_t *vMap,int nVars)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *p;
  char *pcVar3;
  int local_3c;
  int iVar;
  int i;
  char *pToken;
  Vec_Str_t *vTempSop;
  int nVars_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vSupp_local;
  char *pStr_local;
  
  p = Vec_StrAlloc(100);
  _iVar = strtok(pStr,"\n");
  do {
    if (_iVar == (char *)0x0) {
      Vec_StrPush(p,'\0');
      pcVar3 = Vec_StrReleaseArray(p);
      Vec_StrFree(p);
      return pcVar3;
    }
    for (local_3c = 0; local_3c < nVars; local_3c = local_3c + 1) {
      Vec_StrPush(p,'-');
    }
    for (local_3c = 0; _iVar[local_3c] != ' '; local_3c = local_3c + 1) {
      if (_iVar[local_3c] != '-') {
        iVar1 = Vec_IntEntry(vSupp,local_3c);
        iVar1 = Vec_IntEntry(vMap,iVar1);
        if ((iVar1 < 0) || (nVars <= iVar1)) {
          __assert_fail("iVar >= 0 && iVar < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                        ,0x8b0,"char *Acb_RemapOneFunction(char *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        iVar2 = Vec_StrSize(p);
        Vec_StrWriteEntry(p,(iVar2 - nVars) + iVar1,_iVar[local_3c]);
      }
    }
    Vec_StrPrintF(p," %d\n",(ulong)((int)_iVar[local_3c + 1] - 0x30));
    _iVar = strtok((char *)0x0,"\n");
  } while( true );
}

Assistant:

char * Acb_RemapOneFunction( char * pStr, Vec_Int_t * vSupp, Vec_Int_t * vMap, int nVars )
{
    Vec_Str_t * vTempSop = Vec_StrAlloc( 100 );
    char * pToken = strtok( pStr, "\n" );  int i; 
    while ( pToken != NULL )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vTempSop, '-' );
        for ( i = 0; pToken[i] != ' '; i++ )
            if ( pToken[i] != '-' )
            {
                int iVar = Vec_IntEntry( vMap, Vec_IntEntry(vSupp, i) );
                assert( iVar >= 0 && iVar < nVars );
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - nVars + iVar, pToken[i] );
            }
        Vec_StrPrintF( vTempSop, " %d\n", pToken[i+1] - '0' );
        pToken = strtok( NULL, "\n" );
    }
    Vec_StrPush( vTempSop, '\0' );
    pToken = Vec_StrReleaseArray(vTempSop);
    Vec_StrFree( vTempSop );
    return pToken;
}